

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O3

int Pdr_ManCubeJust(Pdr_Man_t *p,int k,Pdr_Set_t *pCube)

{
  uint uVar1;
  undefined4 uVar2;
  Pdr_Set_t *pPVar3;
  Aig_Man_t *pAig;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  Pdr_Set_t *pPVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int Heur;
  
  Heur = 0;
  do {
    pPVar3 = p->pCubeJust;
    pPVar3->nLits = 0;
    pPVar3->Sign = 0;
    Aig_ManIncrementTravId(p->pAig);
    iVar6 = pCube->nLits;
    lVar12 = 0;
    if (0 < iVar6) {
      do {
        uVar1 = *(uint *)(&pCube->field_0x14 + lVar12 * 4);
        if (uVar1 != 0xffffffff) {
          pAig = p->pAig;
          uVar4 = ((int)uVar1 >> 1) + pAig->nTruePos;
          if (((int)uVar4 < 0) || (pAig->vCos->nSize <= (int)uVar4)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          uVar7 = *(ulong *)((long)pAig->vCos->pArray[uVar4] + 8);
          iVar5 = Pdr_NtkFindSatAssign_rec
                            (pAig,(Aig_Obj_t *)(uVar7 & 0xfffffffffffffffe),
                             ~(uVar1 ^ (uint)uVar7) & 1,p->pCubeJust,Heur);
          iVar6 = pCube->nLits;
          if (iVar5 == 0) break;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < iVar6);
    }
    if (iVar6 <= (int)lVar12) {
      pPVar3 = p->pCubeJust;
      uVar1 = pPVar3->nLits;
      uVar7 = (ulong)uVar1;
      if (uVar7 != 0) {
        if (1 < (int)uVar1) {
          pPVar8 = pPVar3 + 1;
          iVar6 = 1;
          uVar9 = 0;
          do {
            uVar7 = uVar7 - 1;
            uVar10 = 0;
            uVar11 = uVar9 & 0xffffffff;
            do {
              if (*(int *)((long)&pPVar8->Sign + uVar10 * 4) <
                  *(int *)(&pPVar3->field_0x14 + (long)(int)uVar11 * 4)) {
                uVar11 = (ulong)(uint)(iVar6 + (int)uVar10);
              }
              uVar10 = uVar10 + 1;
            } while (uVar7 != uVar10);
            uVar2 = *(undefined4 *)(&pPVar3->field_0x14 + uVar9 * 4);
            *(undefined4 *)(&pPVar3->field_0x14 + uVar9 * 4) =
                 *(undefined4 *)(&pPVar3->field_0x14 + (long)(int)uVar11 * 4);
            uVar9 = uVar9 + 1;
            *(undefined4 *)(&pPVar3->field_0x14 + (long)(int)uVar11 * 4) = uVar2;
            iVar6 = iVar6 + 1;
            pPVar8 = (Pdr_Set_t *)((long)&pPVar8->Sign + 4);
          } while (uVar9 != uVar1 - 1);
        }
        iVar6 = Pdr_SetContainsSimple(pPVar3,pCube);
        if ((iVar6 == 0) && (iVar6 = Pdr_ManCheckContainment(p,k,p->pCubeJust), iVar6 == 0)) {
          return 1;
        }
      }
    }
    Heur = Heur + 1;
    if (Heur == 4) {
      return 0;
    }
  } while( true );
}

Assistant:

int Pdr_ManCubeJust( Pdr_Man_t * p, int k, Pdr_Set_t * pCube )
{
    Aig_Obj_t * pNode;
    int i, v, fCompl;
//    return 0;
    for ( i = 0; i < 4; i++ )
    {
        // derive new assignment
        p->pCubeJust->nLits = 0;
        p->pCubeJust->Sign  = 0;
        Aig_ManIncrementTravId( p->pAig );
        for ( v = 0; v < pCube->nLits; v++ )
        {
            if ( pCube->Lits[v] == -1 )
                continue;
            pNode  = Saig_ManLi( p->pAig, lit_var(pCube->Lits[v]) );
            fCompl = lit_sign(pCube->Lits[v]) ^ Aig_ObjFaninC0(pNode);
            if ( !Pdr_NtkFindSatAssign_rec( p->pAig, Aig_ObjFanin0(pNode), !fCompl, p->pCubeJust, i ) )
                break;
        }
        if ( v < pCube->nLits )
            continue;
        // figure this out!!!
        if ( p->pCubeJust->nLits == 0 )
            continue;
        // successfully derived new assignment
        Vec_IntSelectSort( p->pCubeJust->Lits, p->pCubeJust->nLits );
        // check assignment against this cube
        if ( Pdr_SetContainsSimple( p->pCubeJust, pCube ) )
            continue;
//printf( "\n" );
//Pdr_SetPrint( stdout, pCube,        Saig_ManRegNum(p->pAig), NULL ); printf( "\n" );
//Pdr_SetPrint( stdout, p->pCubeJust, Saig_ManRegNum(p->pAig), NULL ); printf( "\n" );
        // check assignment against the clauses
        if ( Pdr_ManCheckContainment( p, k, p->pCubeJust ) )
            continue;
        // find good assignment
        return 1;
    }
    return 0;
}